

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_xonly_pubkey_tweak_add_check
              (secp256k1_context *ctx,uchar *tweaked_pubkey32,int tweaked_pk_parity,
              secp256k1_xonly_pubkey *internal_pubkey,uchar *tweak32)

{
  uint *puVar1;
  uint *puVar2;
  secp256k1_fe *r;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  char cVar8;
  int iVar9;
  int extraout_EAX;
  ulong extraout_RAX;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uchar *seckey;
  uchar *p1;
  ulong uVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  secp256k1_fe *a;
  uint64_t uVar18;
  secp256k1_ecmult_gen_context *ecmult_gen_ctx;
  uchar *p2;
  uint uVar19;
  undefined1 auVar20 [16];
  uchar pk_expected32 [32];
  secp256k1_ge pk;
  uint uStack_1ac;
  secp256k1_ge_storage sStack_1a8;
  secp256k1_ge sStack_168;
  secp256k1_fe *psStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  code *pcStack_e8;
  ulong uStack_d8;
  secp256k1_ge *psStack_d0;
  uchar *puStack_c8;
  secp256k1_fe *psStack_c0;
  byte local_b8 [40];
  secp256k1_ge local_90;
  
  if (ctx == (secp256k1_context *)0x0) {
    psStack_c0 = (secp256k1_fe *)0x11082d;
    secp256k1_xonly_pubkey_tweak_add_check_cold_5();
  }
  else if (internal_pubkey != (secp256k1_xonly_pubkey *)0x0) {
    if (tweaked_pubkey32 == (uchar *)0x0) {
      psStack_c0 = (secp256k1_fe *)0x110839;
      secp256k1_xonly_pubkey_tweak_add_check_cold_3();
      return 0;
    }
    if (tweak32 == (uchar *)0x0) {
      psStack_c0 = (secp256k1_fe *)0x110840;
      secp256k1_xonly_pubkey_tweak_add_check_cold_2();
      return 0;
    }
    psStack_c0 = (secp256k1_fe *)0x11078b;
    iVar9 = secp256k1_pubkey_load(ctx,&local_90,(secp256k1_pubkey *)internal_pubkey);
    if (iVar9 == 0) {
      return 0;
    }
    psStack_c0 = (secp256k1_fe *)0x1107a2;
    iVar9 = secp256k1_ec_pubkey_tweak_add_helper(&local_90,tweak32);
    if (iVar9 == 0) {
      return 0;
    }
    psStack_c0 = (secp256k1_fe *)0x1107b3;
    secp256k1_fe_normalize_var(&local_90.x);
    r = &local_90.y;
    psStack_c0 = (secp256k1_fe *)0x1107c0;
    secp256k1_fe_normalize_var(r);
    psStack_c0 = (secp256k1_fe *)0x1107cb;
    secp256k1_fe_get_b32(local_b8,&local_90.x);
    lVar11 = 0;
    uVar10 = extraout_RAX;
    do {
      uVar12 = uVar10 & 0xffffffff;
      bVar3 = local_b8[lVar11];
      bVar4 = tweaked_pubkey32[lVar11];
      uVar10 = (ulong)((uint)bVar3 - (uint)bVar4);
      if (bVar3 == bVar4) {
        uVar10 = uVar12;
      }
      iVar9 = (int)uVar10;
      if (bVar3 != bVar4) goto LAB_001107ef;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x20);
    iVar9 = 0;
LAB_001107ef:
    if (iVar9 != 0) {
      return 0;
    }
    psStack_c0 = (secp256k1_fe *)0x1107fd;
    a = r;
    secp256k1_fe_verify(r);
    if (local_90.y.normalized != 0) {
      return (uint)(((uint)local_90.y.n[0] & 1) == tweaked_pk_parity);
    }
    psStack_c0 = (secp256k1_fe *)secp256k1_fe_normalize_var;
    secp256k1_xonly_pubkey_tweak_add_check_cold_1();
    pcStack_e8 = (code *)0x110877;
    uStack_d8 = (ulong)(uint)tweaked_pk_parity;
    psStack_d0 = &local_90;
    puStack_c8 = tweaked_pubkey32;
    psStack_c0 = r;
    secp256k1_fe_verify(a);
    uVar10 = (a->n[4] >> 0x30) * 0x1000003d1 + a->n[0];
    uVar12 = (uVar10 >> 0x34) + a->n[1];
    uVar10 = uVar10 & 0xfffffffffffff;
    uVar14 = (uVar12 >> 0x34) + a->n[2];
    uVar15 = (uVar14 >> 0x34) + a->n[3];
    uVar14 = uVar14 & 0xfffffffffffff;
    uVar18 = (uVar15 >> 0x34) + (a->n[4] & 0xffffffffffff);
    uVar13 = uVar12 & 0xfffffffffffff;
    uVar16 = uVar15 & 0xfffffffffffff;
    if (0xffffefffffc2e < uVar10 &&
        ((uVar14 & uVar12 & uVar15) == 0xfffffffffffff && uVar18 == 0xffffffffffff) ||
        uVar18 >> 0x30 != 0) {
      uVar13 = uVar13 + (uVar10 + 0x1000003d1 >> 0x34);
      uVar14 = uVar14 + (uVar13 >> 0x34);
      pauVar17 = (undefined1 (*) [16])(uVar16 + (uVar14 >> 0x34));
      uVar12 = ((ulong)pauVar17 >> 0x34) + uVar18;
      ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(uVar12 & 0x3000000000000);
      if (ecmult_gen_ctx != (secp256k1_ecmult_gen_context *)0x1000000000000) {
        pcStack_e8 = secp256k1_keypair_create;
        secp256k1_fe_normalize_var_cold_1();
        pcStack_e8 = (code *)0x0;
        uStack_f0 = 0xfffffffffffff;
        uStack_f8 = 0xffffffffffff;
        psStack_100 = a;
        if (ecmult_gen_ctx == (secp256k1_ecmult_gen_context *)0x0) {
          secp256k1_keypair_create_cold_4();
        }
        else if (pauVar17 != (undefined1 (*) [16])0x0) {
          pauVar17[5] = (undefined1  [16])0x0;
          pauVar17[4] = (undefined1  [16])0x0;
          pauVar17[3] = (undefined1  [16])0x0;
          pauVar17[2] = (undefined1  [16])0x0;
          pauVar17[1] = (undefined1  [16])0x0;
          *pauVar17 = (undefined1  [16])0x0;
          if (ecmult_gen_ctx->built == 0) {
            secp256k1_keypair_create_cold_2();
            return 0;
          }
          if (seckey == (uchar *)0x0) {
            secp256k1_keypair_create_cold_1();
            return 0;
          }
          iVar9 = secp256k1_ec_pubkey_create_helper(ecmult_gen_ctx,&uStack_1ac,&sStack_168,seckey);
          *pauVar17 = (undefined1  [16])0x0;
          pauVar17[1] = (undefined1  [16])0x0;
          *(uint *)(pauVar17[1] + 0xc) =
               uStack_1ac >> 0x18 | (uStack_1ac & 0xff0000) >> 8 | (uStack_1ac & 0xff00) << 8 |
               uStack_1ac << 0x18;
          secp256k1_ge_to_storage(&sStack_1a8,&sStack_168);
          *(uint64_t *)pauVar17[5] = sStack_1a8.y.n[2];
          *(uint64_t *)(pauVar17[5] + 8) = sStack_1a8.y.n[3];
          *(uint64_t *)pauVar17[4] = sStack_1a8.y.n[0];
          *(uint64_t *)(pauVar17[4] + 8) = sStack_1a8.y.n[1];
          *(uint64_t *)pauVar17[3] = sStack_1a8.x.n[2];
          *(uint64_t *)(pauVar17[3] + 8) = sStack_1a8.x.n[3];
          *(ulong *)pauVar17[2] = CONCAT44(sStack_1a8.x.n[0]._4_4_,(undefined4)sStack_1a8.x.n[0]);
          *(uint64_t *)(pauVar17[2] + 8) = sStack_1a8.x.n[1];
          cVar8 = ((byte)iVar9 ^ 1) - 1;
          auVar20 = ZEXT216(CONCAT11(cVar8,cVar8));
          auVar20 = pshuflw(auVar20,auVar20,0);
          uVar19 = auVar20._0_4_;
          lVar11 = 0;
          do {
            puVar1 = (uint *)(*pauVar17 + lVar11);
            uVar5 = puVar1[1];
            uVar6 = puVar1[2];
            uVar7 = puVar1[3];
            puVar2 = (uint *)(*pauVar17 + lVar11);
            *puVar2 = *puVar1 & uVar19;
            puVar2[1] = uVar5 & uVar19;
            puVar2[2] = uVar6 & uVar19;
            puVar2[3] = uVar7 & uVar19;
            lVar11 = lVar11 + 0x10;
          } while (lVar11 != 0x60);
          return iVar9;
        }
        secp256k1_keypair_create_cold_3();
        return 0;
      }
      uVar16 = (ulong)pauVar17 & 0xfffffffffffff;
      uVar14 = uVar14 & 0xfffffffffffff;
      uVar13 = uVar13 & 0xfffffffffffff;
      uVar10 = uVar10 + 0x1000003d1 & 0xfffffffffffff;
      uVar18 = uVar12 & 0xffffffffffff;
    }
    a->n[0] = uVar10;
    a->n[1] = uVar13;
    a->n[2] = uVar14;
    a->n[3] = uVar16;
    a->n[4] = uVar18;
    a->magnitude = 1;
    a->normalized = 1;
    secp256k1_fe_verify(a);
    return extraout_EAX;
  }
  psStack_c0 = (secp256k1_fe *)0x110832;
  secp256k1_xonly_pubkey_tweak_add_check_cold_4();
  return 0;
}

Assistant:

int secp256k1_xonly_pubkey_tweak_add_check(const secp256k1_context* ctx, const unsigned char *tweaked_pubkey32, int tweaked_pk_parity, const secp256k1_xonly_pubkey *internal_pubkey, const unsigned char *tweak32) {
    secp256k1_ge pk;
    unsigned char pk_expected32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(internal_pubkey != NULL);
    ARG_CHECK(tweaked_pubkey32 != NULL);
    ARG_CHECK(tweak32 != NULL);

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, internal_pubkey)
        || !secp256k1_ec_pubkey_tweak_add_helper(&pk, tweak32)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&pk.x);
    secp256k1_fe_normalize_var(&pk.y);
    secp256k1_fe_get_b32(pk_expected32, &pk.x);

    return secp256k1_memcmp_var(&pk_expected32, tweaked_pubkey32, 32) == 0
            && secp256k1_fe_is_odd(&pk.y) == tweaked_pk_parity;
}